

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_mtree.c
# Opt level: O0

void test_read_format_mtree_nomagic_v1_form(void)

{
  archive_entry *paVar1;
  FILE *__s;
  wchar_t unaff_retaddr;
  char *in_stack_00000008;
  FILE *f;
  archive *a;
  archive_entry *ae;
  char buff [16];
  char reffile [37];
  char *in_stack_000003b0;
  archive *in_stack_ffffffffffffff98;
  archive_entry *paVar2;
  archive_entry **entry;
  archive_entry *entry_00;
  archive *in_stack_ffffffffffffffa0;
  uint uVar4;
  char *e2;
  archive *paVar3;
  char *in_stack_ffffffffffffffa8;
  archive *_a;
  archive *in_stack_ffffffffffffffb0;
  wchar_t line;
  undefined4 local_40;
  wchar_t in_stack_ffffffffffffffc4;
  char *in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  archive *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  wchar_t in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  char *in_stack_fffffffffffffff0;
  void *in_stack_fffffffffffffff8;
  
  memcpy(&stack0xffffffffffffffd8,"test_read_format_mtree_nomagic.mtree",0x25);
  extract_reference_file(in_stack_000003b0);
  paVar1 = (archive_entry *)archive_read_new();
  assertion_assert((char *)in_stack_ffffffffffffffb0,
                   (wchar_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                   in_stack_ffffffffffffff98);
  archive_read_support_filter_all(in_stack_ffffffffffffff98);
  paVar2 = paVar1;
  assertion_equal_int((char *)paVar1,(wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                      (longlong)paVar1,(char *)0x18e600,in_stack_ffffffffffffffd0);
  archive_read_support_format_all((archive *)paVar1);
  paVar1 = paVar2;
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                      (longlong)paVar2,(char *)0x18e639,in_stack_ffffffffffffffd0);
  archive_read_set_options(in_stack_ffffffffffffffa0,(char *)paVar2);
  assertion_equal_int((char *)paVar1,(wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                      (longlong)paVar1,(char *)0x18e679,in_stack_ffffffffffffffd0);
  archive_read_open_filename
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
  paVar2 = paVar1;
  assertion_equal_int((char *)paVar1,(wchar_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                      (longlong)paVar1,(char *)0x18e6bc,in_stack_ffffffffffffffd0);
  __s = fopen("file","wb");
  assertion_assert((char *)__s,(wchar_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,paVar1);
  fwrite("hi\n",1,3,__s);
  entry = (archive_entry **)0x0;
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,0,
                      (char *)0x18e74b,in_stack_ffffffffffffffd0);
  fclose(__s);
  archive_read_next_header(in_stack_ffffffffffffffa0,entry);
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                      (longlong)paVar2,(char *)0x18e793,in_stack_ffffffffffffffd0);
  archive_format((archive *)paVar2);
  paVar1 = (archive_entry *)0x0;
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,0,
                      (char *)0x18e7cf,in_stack_ffffffffffffffd0);
  uVar4 = (uint)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  archive_entry_pathname(paVar1);
  e2 = (char *)((ulong)uVar4 << 0x20);
  assertion_equal_string
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,(char *)paVar2,(char *)__s,
             in_stack_ffffffffffffffa8,e2,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  archive_entry_uid((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,e2,0,(char *)0x18e852,
                      in_stack_ffffffffffffffd0);
  archive_entry_filetype((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,e2,0,(char *)0x18e88f,
                      in_stack_ffffffffffffffd0);
  archive_entry_mode((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,e2,0,(char *)0x18e8cc,
                      in_stack_ffffffffffffffd0);
  archive_entry_size((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,e2,0,(char *)0x18e908,
                      in_stack_ffffffffffffffd0);
  archive_read_data(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                    (size_t)in_stack_ffffffffffffffc8);
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),
                      (longlong)in_stack_ffffffffffffffa8,e2,0,(char *)0x18e94d,
                      in_stack_ffffffffffffffd0);
  paVar3 = (archive *)0x2eb605;
  _a = (archive *)0x0;
  assertion_equal_mem(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,
                      in_stack_fffffffffffffff0,
                      (void *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                      in_stack_ffffffffffffffe0,(size_t)a,(char *)ae,(void *)buff._0_8_);
  archive_entry_is_encrypted((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,0,
                      (char *)0x18e9d1,in_stack_ffffffffffffffd0);
  archive_read_has_encrypted_entries(_a);
  paVar1 = paVar2;
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,
                      (longlong)paVar2,(char *)0x18ea0d,in_stack_ffffffffffffffd0);
  archive_read_next_header(paVar3,(archive_entry **)paVar2);
  paVar2 = paVar1;
  assertion_equal_int((char *)paVar1,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,
                      (longlong)paVar1,(char *)0x18ea4b,in_stack_ffffffffffffffd0);
  archive_entry_pathname(paVar1);
  paVar3 = (archive *)((ulong)paVar3 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,(char *)paVar2,(char *)__s,
             (char *)_a,(char *)paVar3,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  archive_entry_filetype((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,0,
                      (char *)0x18eacf,in_stack_ffffffffffffffd0);
  archive_entry_is_encrypted((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,0,
                      (char *)0x18eb08,in_stack_ffffffffffffffd0);
  archive_read_has_encrypted_entries(_a);
  paVar1 = paVar2;
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,
                      (longlong)paVar2,(char *)0x18eb44,in_stack_ffffffffffffffd0);
  archive_read_next_header(paVar3,(archive_entry **)paVar2);
  paVar2 = paVar1;
  assertion_equal_int((char *)paVar1,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,
                      (longlong)paVar1,(char *)0x18eb82,in_stack_ffffffffffffffd0);
  archive_entry_pathname(paVar1);
  paVar3 = (archive *)((ulong)paVar3 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,(char *)paVar2,(char *)__s,
             (char *)_a,(char *)paVar3,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  archive_entry_is_encrypted((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,0,
                      (char *)0x18ec02,in_stack_ffffffffffffffd0);
  archive_read_has_encrypted_entries(_a);
  paVar1 = paVar2;
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,
                      (longlong)paVar2,(char *)0x18ec3e,in_stack_ffffffffffffffd0);
  archive_read_next_header(paVar3,(archive_entry **)paVar2);
  paVar2 = paVar1;
  assertion_equal_int((char *)paVar1,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,
                      (longlong)paVar1,(char *)0x18ec7c,in_stack_ffffffffffffffd0);
  archive_entry_pathname(paVar1);
  paVar3 = (archive *)((ulong)paVar3 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,(char *)paVar2,(char *)__s,
             (char *)_a,(char *)paVar3,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  archive_entry_is_encrypted((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,0,
                      (char *)0x18ecfc,in_stack_ffffffffffffffd0);
  archive_read_has_encrypted_entries(_a);
  paVar1 = paVar2;
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,
                      (longlong)paVar2,(char *)0x18ed38,in_stack_ffffffffffffffd0);
  archive_read_next_header(paVar3,(archive_entry **)paVar2);
  paVar2 = paVar1;
  assertion_equal_int((char *)paVar1,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,
                      (longlong)paVar1,(char *)0x18ed76,in_stack_ffffffffffffffd0);
  archive_entry_pathname(paVar1);
  paVar3 = (archive *)((ulong)paVar3 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,(char *)paVar2,(char *)__s,
             (char *)_a,(char *)paVar3,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  archive_entry_is_encrypted((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,0,
                      (char *)0x18edf6,in_stack_ffffffffffffffd0);
  archive_read_has_encrypted_entries(_a);
  paVar1 = paVar2;
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,
                      (longlong)paVar2,(char *)0x18ee32,in_stack_ffffffffffffffd0);
  archive_read_next_header(paVar3,(archive_entry **)paVar2);
  paVar2 = paVar1;
  assertion_equal_int((char *)paVar1,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,
                      (longlong)paVar1,(char *)0x18ee70,in_stack_ffffffffffffffd0);
  archive_entry_pathname(paVar1);
  paVar3 = (archive *)((ulong)paVar3 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,(char *)paVar2,(char *)__s,
             (char *)_a,(char *)paVar3,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  archive_entry_is_encrypted((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,0,
                      (char *)0x18eef0,in_stack_ffffffffffffffd0);
  archive_read_has_encrypted_entries(_a);
  paVar1 = paVar2;
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,
                      (longlong)paVar2,(char *)0x18ef2c,in_stack_ffffffffffffffd0);
  archive_read_next_header(paVar3,(archive_entry **)paVar2);
  paVar2 = paVar1;
  assertion_equal_int((char *)paVar1,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,
                      (longlong)paVar1,(char *)0x18ef6a,in_stack_ffffffffffffffd0);
  archive_entry_pathname(paVar1);
  paVar3 = (archive *)((ulong)paVar3 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,(char *)paVar2,(char *)__s,
             (char *)_a,(char *)paVar3,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  archive_entry_is_encrypted((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,0,
                      (char *)0x18efea,in_stack_ffffffffffffffd0);
  archive_read_has_encrypted_entries(_a);
  paVar1 = paVar2;
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,
                      (longlong)paVar2,(char *)0x18f026,in_stack_ffffffffffffffd0);
  archive_read_next_header(paVar3,(archive_entry **)paVar2);
  paVar2 = paVar1;
  assertion_equal_int((char *)paVar1,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,
                      (longlong)paVar1,(char *)0x18f064,in_stack_ffffffffffffffd0);
  archive_entry_pathname(paVar1);
  paVar3 = (archive *)((ulong)paVar3 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,(char *)paVar2,(char *)__s,
             (char *)_a,(char *)paVar3,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  archive_entry_mode((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,0,
                      (char *)0x18f0e8,in_stack_ffffffffffffffd0);
  archive_entry_is_encrypted((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,0,
                      (char *)0x18f121,in_stack_ffffffffffffffd0);
  archive_read_has_encrypted_entries(_a);
  paVar1 = paVar2;
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,
                      (longlong)paVar2,(char *)0x18f15d,in_stack_ffffffffffffffd0);
  archive_read_next_header(paVar3,(archive_entry **)paVar2);
  paVar2 = paVar1;
  assertion_equal_int((char *)paVar1,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,
                      (longlong)paVar1,(char *)0x18f19b,in_stack_ffffffffffffffd0);
  archive_entry_pathname(paVar1);
  paVar3 = (archive *)((ulong)paVar3 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,(char *)paVar2,(char *)__s,
             (char *)_a,(char *)paVar3,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  archive_entry_is_encrypted((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,0,
                      (char *)0x18f21b,in_stack_ffffffffffffffd0);
  archive_read_has_encrypted_entries(_a);
  paVar1 = paVar2;
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,
                      (longlong)paVar2,(char *)0x18f257,in_stack_ffffffffffffffd0);
  archive_read_next_header(paVar3,(archive_entry **)paVar2);
  paVar2 = paVar1;
  assertion_equal_int((char *)paVar1,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,
                      (longlong)paVar1,(char *)0x18f295,in_stack_ffffffffffffffd0);
  archive_entry_pathname(paVar1);
  paVar3 = (archive *)((ulong)paVar3 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,(char *)paVar2,(char *)__s,
             (char *)_a,(char *)paVar3,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  archive_entry_is_encrypted((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,0,
                      (char *)0x18f315,in_stack_ffffffffffffffd0);
  archive_read_has_encrypted_entries(_a);
  entry_00 = paVar2;
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,
                      (longlong)paVar2,(char *)0x18f351,in_stack_ffffffffffffffd0);
  archive_read_next_header(paVar3,(archive_entry **)paVar2);
  paVar1 = entry_00;
  assertion_equal_int((char *)entry_00,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,
                      (longlong)entry_00,(char *)0x18f38f,in_stack_ffffffffffffffd0);
  archive_entry_pathname(entry_00);
  paVar3 = (archive *)((ulong)paVar3 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,(char *)paVar1,(char *)__s,
             (char *)_a,(char *)paVar3,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  archive_entry_is_encrypted((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  assertion_equal_int((char *)paVar1,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,0,
                      (char *)0x18f40f,in_stack_ffffffffffffffd0);
  archive_read_has_encrypted_entries(_a);
  paVar2 = paVar1;
  assertion_equal_int((char *)paVar1,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,
                      (longlong)paVar1,(char *)0x18f44b,in_stack_ffffffffffffffd0);
  archive_read_next_header(paVar3,(archive_entry **)paVar1);
  paVar1 = paVar2;
  assertion_equal_int((char *)paVar2,(wchar_t)((ulong)__s >> 0x20),(longlong)_a,(char *)paVar3,
                      (longlong)paVar2,(char *)0x18f489,in_stack_ffffffffffffffd0);
  archive_entry_pathname(paVar2);
  paVar3 = (archive *)((ulong)paVar3 & 0xffffffff00000000);
  assertion_equal_string
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,(char *)paVar1,(char *)__s,
             (char *)_a,(char *)paVar3,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8);
  line = (wchar_t)((ulong)__s >> 0x20);
  archive_entry_is_encrypted((archive_entry *)CONCAT44(in_stack_ffffffffffffffc4,local_40));
  assertion_equal_int((char *)paVar1,line,(longlong)_a,(char *)paVar3,0,(char *)0x18f509,
                      in_stack_ffffffffffffffd0);
  archive_read_has_encrypted_entries(_a);
  paVar2 = paVar1;
  assertion_equal_int((char *)paVar1,line,(longlong)_a,(char *)paVar3,(longlong)paVar1,
                      (char *)0x18f545,in_stack_ffffffffffffffd0);
  archive_read_next_header(paVar3,(archive_entry **)paVar1);
  assertion_equal_int((char *)paVar2,line,(longlong)_a,(char *)paVar3,(longlong)paVar2,
                      (char *)0x18f584,in_stack_ffffffffffffffd0);
  archive_file_count((archive *)paVar2);
  assertion_equal_int((char *)paVar2,line,(longlong)_a,(char *)paVar3,0,(char *)0x18f5bf,
                      in_stack_ffffffffffffffd0);
  archive_read_close((archive *)0x18f5c9);
  assertion_equal_int((char *)paVar2,line,(longlong)_a,(char *)paVar3,0,(char *)0x18f5f7,
                      in_stack_ffffffffffffffd0);
  archive_read_free((archive *)0x18f601);
  assertion_equal_int((char *)paVar2,line,(longlong)_a,(char *)paVar3,0,(char *)0x18f62f,
                      in_stack_ffffffffffffffd0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_mtree_nomagic_v1_form)
{
	const char reffile[] = "test_read_format_mtree_nomagic.mtree";
	char buff[16];
	struct archive_entry *ae;
	struct archive *a;
	FILE *f;

	extract_reference_file(reffile);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_set_options(a, "mtree:checkfs"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, reffile, 11));

	/*
	 * Read "file", whose data is available on disk.
	 */
	f = fopen("file", "wb");
	assert(f != NULL);
	assertEqualInt(3, fwrite("hi\n", 1, 3, f));
	fclose(f);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_MTREE);
	assertEqualString(archive_entry_pathname(ae), "file");
	assertEqualInt(archive_entry_uid(ae), 18);
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0123);
	assertEqualInt(archive_entry_size(ae), 3);
	assertEqualInt(3, archive_read_data(a, buff, 3));
	assertEqualMem(buff, "hi\n", 3);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "dir");
	assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "dir/file with space");
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "file with space");
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "dir2");
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "dir2/dir3a");
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "dir2/dir3a/indir3a");
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "dir2/fullindir2");
	assertEqualInt(archive_entry_mode(ae), AE_IFREG | 0644);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "dir2/indir2");
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "dir2/dir3b");
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "dir2/dir3b/indir3b");
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(archive_entry_pathname(ae), "notindir");
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(12, archive_file_count(a));
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}